

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSystemTools.cxx
# Opt level: O3

bool cmSystemTools::RunSingleCommand
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *command,string *captureStdOut,string *captureStdErr,int *retVal,char *dir,
               OutputOption outputflag,double timeout)

{
  char cVar1;
  int iVar2;
  cmsysProcess *cp;
  char *pcVar3;
  size_t sVar4;
  long lVar5;
  pointer pbVar6;
  bool bVar7;
  int length;
  char *data;
  vector<char,_std::allocator<char>_> tempStdOut;
  vector<const_char_*,_std::allocator<const_char_*>_> argv;
  vector<char,_std::allocator<char>_> tempStdErr;
  int local_b4;
  char *local_b0;
  char *local_a8;
  char *pcStack_a0;
  long local_98;
  char **local_88;
  iterator iStack_80;
  char **local_78;
  double local_70;
  void *local_68;
  void *pvStack_60;
  long local_58;
  char *local_48;
  string *local_40;
  int *local_38;
  
  local_88 = (char **)0x0;
  iStack_80._M_current = (char **)0x0;
  local_78 = (char **)0x0;
  pbVar6 = (command->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  local_70 = timeout;
  local_38 = retVal;
  if (pbVar6 == (command->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_finish) {
LAB_003530d7:
    local_a8 = (char *)0x0;
    std::vector<char_const*,std::allocator<char_const*>>::_M_realloc_insert<char_const*>
              ((vector<char_const*,std::allocator<char_const*>> *)&local_88,iStack_80,&local_a8);
  }
  else {
    local_48 = dir;
    local_40 = captureStdErr;
    do {
      local_a8 = (pbVar6->_M_dataplus)._M_p;
      if (iStack_80._M_current == local_78) {
        std::vector<char_const*,std::allocator<char_const*>>::_M_realloc_insert<char_const*>
                  ((vector<char_const*,std::allocator<char_const*>> *)&local_88,iStack_80,&local_a8)
        ;
      }
      else {
        *iStack_80._M_current = local_a8;
        iStack_80._M_current = iStack_80._M_current + 1;
      }
      pbVar6 = pbVar6 + 1;
    } while (pbVar6 != (command->
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_finish);
    local_a8 = (char *)0x0;
    dir = local_48;
    captureStdErr = local_40;
    if (iStack_80._M_current == local_78) goto LAB_003530d7;
    *iStack_80._M_current = (char *)0x0;
    iStack_80._M_current = iStack_80._M_current + 1;
  }
  if (captureStdOut != (string *)0x0) {
    std::__cxx11::string::_M_replace
              ((ulong)captureStdOut,0,(char *)captureStdOut->_M_string_length,0x5e12e9);
  }
  if (captureStdErr != captureStdOut && captureStdErr != (string *)0x0) {
    std::__cxx11::string::_M_replace
              ((ulong)captureStdErr,0,(char *)captureStdErr->_M_string_length,0x5e12e9);
  }
  cp = cmsysProcess_New();
  cmsysProcess_SetCommand(cp,local_88);
  cmsysProcess_SetWorkingDirectory(cp,dir);
  if (s_RunCommandHideConsole == true) {
    cmsysProcess_SetOption(cp,0,1);
  }
  if (outputflag == OUTPUT_PASSTHROUGH) {
    cmsysProcess_SetPipeShared(cp,2,1);
    cmsysProcess_SetPipeShared(cp,3,1);
  }
  cmsysProcess_SetTimeout(cp,local_70);
  cmsysProcess_Execute(cp);
  local_70 = (double)CONCAT71(local_70._1_7_,
                              captureStdErr == captureStdOut || captureStdErr == (string *)0x0);
  local_a8 = (char *)0x0;
  pcStack_a0 = (char *)0x0;
  local_98 = 0;
  local_58 = 0;
  local_68 = (void *)0x0;
  pvStack_60 = (void *)0x0;
  if ((outputflag != OUTPUT_PASSTHROUGH) &&
     ((captureStdOut != (string *)0x0 || captureStdErr != (string *)0x0) ||
      outputflag != OUTPUT_NONE)) {
LAB_003531e7:
    do {
      iVar2 = cmsysProcess_WaitForData(cp,&local_b0,&local_b4,(double *)0x0);
      if (iVar2 < 1) break;
      if (0 < local_b4) {
        lVar5 = 0;
        do {
          if (local_b0[lVar5] == '\0') {
            local_b0[lVar5] = ' ';
          }
          lVar5 = lVar5 + 1;
        } while (lVar5 < local_b4);
      }
      if ((iVar2 == 2) || (iVar2 == 3 && captureStdErr == captureStdOut)) {
        if (captureStdOut != (string *)0x0) {
          std::vector<char,std::allocator<char>>::_M_range_insert<char*>
                    ((vector<char,std::allocator<char>> *)&local_a8,pcStack_a0);
        }
      }
      else if (captureStdErr != (string *)0x0 && iVar2 == 3) {
        std::vector<char,std::allocator<char>>::_M_range_insert<char*>
                  ((vector<char,std::allocator<char>> *)&local_68,pvStack_60);
      }
      if (outputflag != OUTPUT_NONE) {
        if (outputflag != OUTPUT_MERGE) {
          if (iVar2 == 3) {
            Stderr(local_b0,(long)local_b4);
            goto LAB_003531e7;
          }
          if (iVar2 != 2) goto LAB_003531e7;
        }
        Stdout(local_b0,(long)local_b4);
      }
    } while( true );
  }
  cmsysProcess_WaitForExit(cp,(double *)0x0);
  cVar1 = local_70._0_1_;
  if ((captureStdOut != (string *)0x0) && (local_a8 != pcStack_a0)) {
    std::__cxx11::string::append((char *)captureStdOut,(ulong)local_a8);
  }
  if ((cVar1 == '\0') && (local_68 != pvStack_60)) {
    std::__cxx11::string::append((char *)captureStdErr,(ulong)local_68);
  }
  iVar2 = cmsysProcess_GetState(cp);
  if (iVar2 == 4) {
    if (local_38 == (int *)0x0) {
      iVar2 = cmsysProcess_GetExitValue(cp);
      bVar7 = iVar2 == 0;
    }
    else {
      iVar2 = cmsysProcess_GetExitValue(cp);
      *local_38 = iVar2;
      bVar7 = true;
    }
  }
  else {
    iVar2 = cmsysProcess_GetState(cp);
    if (iVar2 == 2) {
      pcVar3 = cmsysProcess_GetExceptionString(cp);
      if (outputflag != OUTPUT_NONE) {
        if (pcVar3 == (char *)0x0) {
          std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x6cabc0);
        }
        else {
          sVar4 = strlen(pcVar3);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar3,sVar4);
        }
        std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + -0x40);
        std::ostream::put(-0x40);
        std::ostream::flush();
      }
      if (captureStdErr != (string *)0x0) {
        strlen(pcVar3);
        std::__cxx11::string::append((char *)captureStdErr,(ulong)pcVar3);
      }
    }
    else {
      iVar2 = cmsysProcess_GetState(cp);
      if (iVar2 == 1) {
        pcVar3 = cmsysProcess_GetErrorString(cp);
        if (outputflag != OUTPUT_NONE) {
          if (pcVar3 == (char *)0x0) {
            std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x6cabc0);
          }
          else {
            sVar4 = strlen(pcVar3);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar3,sVar4);
          }
          std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + -0x40);
          std::ostream::put(-0x40);
          std::ostream::flush();
        }
        if (captureStdErr != (string *)0x0) {
          strlen(pcVar3);
          std::__cxx11::string::append((char *)captureStdErr,(ulong)pcVar3);
        }
      }
      else {
        iVar2 = cmsysProcess_GetState(cp);
        bVar7 = true;
        if (iVar2 != 5) goto LAB_00353549;
        if (outputflag != OUTPUT_NONE) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,"Process terminated due to timeout\n",0x22);
          std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + -0x40);
          std::ostream::put(-0x40);
          std::ostream::flush();
        }
        if (captureStdErr != (string *)0x0) {
          std::__cxx11::string::append((char *)captureStdErr,0x58552a);
        }
      }
    }
    bVar7 = false;
  }
LAB_00353549:
  cmsysProcess_Delete(cp);
  if (local_68 != (void *)0x0) {
    operator_delete(local_68,local_58 - (long)local_68);
  }
  if (local_a8 != (char *)0x0) {
    operator_delete(local_a8,local_98 - (long)local_a8);
  }
  if (local_88 != (char **)0x0) {
    operator_delete(local_88,(long)local_78 - (long)local_88);
  }
  return bVar7;
}

Assistant:

bool cmSystemTools::RunSingleCommand(std::vector<std::string>const& command,
                                     std::string* captureStdOut,
                                     std::string* captureStdErr,
                                     int* retVal , const char* dir ,
                                     OutputOption outputflag ,
                                     double timeout )
{
  std::vector<const char*> argv;
  for(std::vector<std::string>::const_iterator a = command.begin();
      a != command.end(); ++a)
    {
    argv.push_back(a->c_str());
    }
  argv.push_back(0);
  if ( captureStdOut )
    {
    *captureStdOut = "";
    }
  if (captureStdErr && captureStdErr != captureStdOut)
    {
    *captureStdErr = "";
    }

  cmsysProcess* cp = cmsysProcess_New();
  cmsysProcess_SetCommand(cp, &*argv.begin());
  cmsysProcess_SetWorkingDirectory(cp, dir);
  if(cmSystemTools::GetRunCommandHideConsole())
    {
    cmsysProcess_SetOption(cp, cmsysProcess_Option_HideWindow, 1);
    }

  if (outputflag == OUTPUT_PASSTHROUGH)
    {
    cmsysProcess_SetPipeShared(cp, cmsysProcess_Pipe_STDOUT, 1);
    cmsysProcess_SetPipeShared(cp, cmsysProcess_Pipe_STDERR, 1);
    }

  cmsysProcess_SetTimeout(cp, timeout);
  cmsysProcess_Execute(cp);

  std::vector<char> tempStdOut;
  std::vector<char> tempStdErr;
  char* data;
  int length;
  int pipe;
  if(outputflag != OUTPUT_PASSTHROUGH &&
     (captureStdOut || captureStdErr || outputflag != OUTPUT_NONE))
    {
    while((pipe = cmsysProcess_WaitForData(cp, &data, &length, 0)) > 0)
      {
      if(captureStdOut || captureStdErr || outputflag != OUTPUT_NONE)
        {
        // Translate NULL characters in the output into valid text.
        // Visual Studio 7 puts these characters in the output of its
        // build process.
        for(int i=0; i < length; ++i)
          {
          if(data[i] == '\0')
            {
            data[i] = ' ';
            }
          }
        }
      if(pipe == cmsysProcess_Pipe_STDOUT ||
         (pipe == cmsysProcess_Pipe_STDERR &&
          captureStdOut == captureStdErr))
        {
        if (captureStdOut)
          {
          tempStdOut.insert(tempStdOut.end(), data, data+length);
          }
        }
      else if(pipe == cmsysProcess_Pipe_STDERR)
        {
        if (captureStdErr)
          {
          tempStdErr.insert(tempStdErr.end(), data, data+length);
          }
        }
      if(outputflag != OUTPUT_NONE)
        {
        if(outputflag == OUTPUT_MERGE)
          {
          cmSystemTools::Stdout(data, length);
          }
        else
          {
          if(pipe == cmsysProcess_Pipe_STDERR)
            {
            cmSystemTools::Stderr(data, length);
            }
          else if(pipe == cmsysProcess_Pipe_STDOUT)
            {
            cmSystemTools::Stdout(data, length);
            }
          }
        }
      }
    }

  cmsysProcess_WaitForExit(cp, 0);
  if ( captureStdOut && tempStdOut.begin() != tempStdOut.end())
    {
    captureStdOut->append(&*tempStdOut.begin(), tempStdOut.size());
    }
  if ( captureStdErr && captureStdErr != captureStdOut &&
       tempStdErr.begin() != tempStdErr.end())
    {
    captureStdErr->append(&*tempStdErr.begin(), tempStdErr.size());
    }

  bool result = true;
  if(cmsysProcess_GetState(cp) == cmsysProcess_State_Exited)
    {
    if ( retVal )
      {
      *retVal = cmsysProcess_GetExitValue(cp);
      }
    else
      {
      if ( cmsysProcess_GetExitValue(cp) !=  0 )
        {
        result = false;
        }
      }
    }
  else if(cmsysProcess_GetState(cp) == cmsysProcess_State_Exception)
    {
    const char* exception_str = cmsysProcess_GetExceptionString(cp);
    if ( outputflag != OUTPUT_NONE )
      {
      std::cerr << exception_str << std::endl;
      }
    if ( captureStdErr )
      {
      captureStdErr->append(exception_str, strlen(exception_str));
      }
    result = false;
    }
  else if(cmsysProcess_GetState(cp) == cmsysProcess_State_Error)
    {
    const char* error_str = cmsysProcess_GetErrorString(cp);
    if ( outputflag != OUTPUT_NONE )
      {
      std::cerr << error_str << std::endl;
      }
    if ( captureStdErr )
      {
      captureStdErr->append(error_str, strlen(error_str));
      }
    result = false;
    }
  else if(cmsysProcess_GetState(cp) == cmsysProcess_State_Expired)
    {
    const char* error_str = "Process terminated due to timeout\n";
    if ( outputflag != OUTPUT_NONE )
      {
      std::cerr << error_str << std::endl;
      }
    if ( captureStdErr )
      {
      captureStdErr->append(error_str, strlen(error_str));
      }
    result = false;
    }

  cmsysProcess_Delete(cp);
  return result;
}